

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-convert.cpp
# Opt level: O1

void test_convert<float,int>(uint length,float value)

{
  void *pvVar1;
  undefined8 *puVar2;
  ulong uVar3;
  long lVar4;
  shared_ptr<float> pt;
  shared_ptr<int> pu;
  
  uVar3 = 0xffffffffffffffff;
  if (-1 < (int)length) {
    uVar3 = (long)(int)length * 4;
  }
  pu.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = value;
  pvVar1 = operator_new__(uVar3);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<float*,void(*)(float*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pt,pvVar1,nosimd::common::free<float>);
  pt.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new__(uVar3);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<int*,void(*)(int*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pu,
             pt.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             nosimd::common::free<int>);
  if (0 < (int)length) {
    uVar3 = 0;
    do {
      *(float *)((long)pvVar1 + uVar3 * 4) =
           pu.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_;
      uVar3 = uVar3 + 1;
    } while (length != uVar3);
    if (0 < (int)length) {
      uVar3 = 0;
      do {
        *(int *)((long)&(pt.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                        ->_vptr__Sp_counted_base + uVar3 * 4) =
             (int)*(float *)((long)pvVar1 + uVar3 * 4);
        uVar3 = uVar3 + 1;
      } while (length != uVar3);
    }
  }
  if (length != 0) {
    lVar4 = 0;
    do {
      if (*(int *)((long)&(pt.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi)->_vptr__Sp_counted_base + lVar4 * 4) !=
          (int)pu.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_) {
        puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar2 = "void test_convert(unsigned int, _T) [_T = float, _U = int]";
        *(undefined4 *)(puVar2 + 1) = 0x17;
        *(uint *)((long)puVar2 + 0xc) = length;
        __cxa_throw(puVar2,&Exception::typeinfo,0);
      }
      lVar4 = lVar4 + 1;
    } while (length != (uint)lVar4);
  }
  if (pu.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pu.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (pt.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pt.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void test_convert(unsigned length, _T value)
{
    auto pt = std::shared_ptr<_T>(simd::malloc<_T>(length), simd::free<_T>);
    auto pu = std::shared_ptr<_U>(simd::malloc<_U>(length), simd::free<_U>);
    _T * t = pt.get();
    _U * u = pu.get();

    simd::set(value, t, length);
    simd::convert(t, u, length);

    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(u[i], (_U)value))
            FAIL();
    }
}